

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          StringPtr *params_2)

{
  StringPtr *pSVar1;
  char (*value) [2];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  StringPtr *local_28;
  StringPtr *params_local_2;
  char (*params_local_1) [2];
  StringPtr *params_local;
  
  local_28 = (StringPtr *)params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [2])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)this);
  local_38 = toCharSequence<kj::StringPtr>(pSVar1);
  value = ::const((char (*) [2])params_local_2);
  local_48 = toCharSequence<char_const(&)[2]>(value);
  pSVar1 = fwd<kj::StringPtr&>(local_28);
  local_58 = toCharSequence<kj::StringPtr&>(pSVar1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}